

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O2

void __thiscall QTextStream::~QTextStream(QTextStream *this)

{
  _Head_base<0UL,_QTextStreamPrivate_*,_false> this_00;
  
  this_00._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
       super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl;
  if (*(qsizetype *)((long)&(this_00._M_head_impl)->writeBuffer + 0x10) != 0) {
    QTextStreamPrivate::flushWriteBuffer(this_00._M_head_impl);
  }
  std::unique_ptr<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>::~unique_ptr
            (&this->d_ptr);
  return;
}

Assistant:

QTextStream::~QTextStream()
{
    Q_D(QTextStream);
#if defined (QTEXTSTREAM_DEBUG)
    qDebug("QTextStream::~QTextStream()");
#endif
    if (!d->writeBuffer.isEmpty())
        d->flushWriteBuffer();
}